

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

string * __thiscall
VectorInstance::op_sliceFromIndex
          (string *__return_storage_ptr__,VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  string *value;
  pointer psVar1;
  __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
  __last;
  undefined8 *puVar2;
  char *pcVar3;
  allocator_type local_81;
  IntegerInstance local_80;
  
  value = (arguments->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)value == 0x20) {
    IntegerInstance::IntegerInstance(&local_80,value);
    CharacterInstance::~CharacterInstance((CharacterInstance *)&local_80);
    if (-1 < (long)local_80._value) {
      psVar1 = (this->_value).
               super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           (this->_value).
           super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (local_80._value <= (int)((ulong)((long)__last._M_current - (long)psVar1) >> 4)) {
        std::vector<std::shared_ptr<Instance>,std::allocator<std::shared_ptr<Instance>>>::
        vector<__gnu_cxx::__normal_iterator<std::shared_ptr<Instance>*,std::vector<std::shared_ptr<Instance>,std::allocator<std::shared_ptr<Instance>>>>,void>
                  ((vector<std::shared_ptr<Instance>,std::allocator<std::shared_ptr<Instance>>> *)
                   &local_80,psVar1 + local_80._value,__last,&local_81);
        vector_representation_abi_cxx11_
                  (__return_storage_ptr__,
                   (vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *
                   )&local_80);
        std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::~vector
                  ((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *
                   )&local_80);
        return __return_storage_ptr__;
      }
    }
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar3 = "RuntimeError: invalid argument.";
  }
  else {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar3 = "RuntimeError: wrong number of arguments.";
  }
  *puVar2 = pcVar3;
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

std::string VectorInstance::op_sliceFromIndex(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    int index = IntegerInstance(arguments[0]).value();
    if (index < 0 || index > int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    return vector_representation(std::vector<std::shared_ptr<Instance>>(_value.begin() + index, _value.end()));
}